

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void emit(internal_state *state,uint32_t data,int bits)

{
  uint8_t *puVar1;
  int local_18;
  int bits_local;
  uint32_t data_local;
  internal_state *state_local;
  
  if (state->bits < bits) {
    local_18 = bits - state->bits;
    puVar1 = state->cds;
    state->cds = puVar1 + 1;
    *puVar1 = *puVar1 + (char)(data >> ((byte)local_18 & 0x3f));
    while (8 < local_18) {
      local_18 = local_18 + -8;
      puVar1 = state->cds;
      state->cds = puVar1 + 1;
      *puVar1 = (uint8_t)(data >> ((byte)local_18 & 0x1f));
    }
    state->bits = 8 - local_18;
    *state->cds = (uint8_t)(data << ((byte)state->bits & 0x1f));
  }
  else {
    state->bits = state->bits - bits;
    *state->cds = *state->cds + (char)(data << ((byte)state->bits & 0x1f));
  }
  return;
}

Assistant:

static inline void emit(struct internal_state *state,
                        uint32_t data, int bits)
{
    /**
       Emit sequence of bits.
     */

    if (bits <= state->bits) {
        state->bits -= bits;
        *state->cds += (uint8_t)(data << state->bits);
    } else {
        bits -= state->bits;
        *state->cds++ += (uint8_t)((uint64_t)data >> bits);

        while (bits > 8) {
            bits -= 8;
            *state->cds++ = (uint8_t)(data >> bits);
        }

        state->bits = 8 - bits;
        *state->cds = (uint8_t)(data << state->bits);
    }
}